

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O1

void __thiscall UdpLayer::UdpLayer(UdpLayer *this,UdpReceiver *udpr,sockaddr_in *local)

{
  undefined8 uVar1;
  in_port_t iVar2;
  in_addr iVar3;
  
  bdThread::bdThread(&this->super_bdThread);
  (this->super_bdThread)._vptr_bdThread = (_func_int **)&PTR__UdpLayer_00156978;
  this->recv = udpr;
  iVar2 = local->sin_port;
  iVar3.s_addr = (local->sin_addr).s_addr;
  uVar1 = *(undefined8 *)local->sin_zero;
  (this->laddr).sin_family = local->sin_family;
  (this->laddr).sin_port = iVar2;
  (this->laddr).sin_addr = (in_addr)iVar3.s_addr;
  *(undefined8 *)(this->laddr).sin_zero = uVar1;
  this->errorState = 0;
  this->ttl = 0x40;
  bdMutex::bdMutex(&this->sockMtx,false);
  this->isAlive = true;
  openSocket(this);
  return;
}

Assistant:

UdpLayer::UdpLayer(UdpReceiver *udpr, struct sockaddr_in &local)
	:recv(udpr), laddr(local), errorState(0), ttl(UDP_DEF_TTL) {
	openSocket();
	return;
}